

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

int xrep0_sock_set_maxttl(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  int local_1c [2];
  int ttl;
  
  iVar1 = nni_copyin_int(local_1c,buf,sz,1,0xf,t);
  if (iVar1 == 0) {
    nni_atomic_set((nni_atomic_int *)((long)arg + 0x38),local_1c[0]);
  }
  return iVar1;
}

Assistant:

static int
xrep0_sock_set_maxttl(void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	xrep0_sock *s = arg;
	int         ttl;
	int         rv;
	if ((rv = nni_copyin_int(&ttl, buf, sz, 1, NNI_MAX_MAX_TTL, t)) == 0) {
		nni_atomic_set(&s->ttl, ttl);
	}
	return (rv);
}